

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanodet.cpp
# Opt level: O3

void generate_proposals(Mat *cls_pred,Mat *dis_pred,int stride,Mat *in_pad,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Layer *pLVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  vector<Object,_std::allocator<Object>_> *in_R9;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float pred_ltrb [4];
  Option opt;
  uint local_14c;
  ulong local_140;
  ParamDict local_128;
  long local_110;
  Mat *local_108;
  void *local_100;
  int *local_f8;
  long local_f0;
  undefined4 local_e8;
  long *local_e0;
  undefined4 local_d8;
  uint local_d4;
  undefined8 local_d0;
  undefined4 local_c8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  Mat *local_a8;
  long local_a0;
  vector<Object,_std::allocator<Object>_> *local_98;
  long local_90;
  undefined1 local_88 [16];
  undefined1 local_70 [12];
  float fStack_64;
  int local_60;
  float local_5c;
  bool local_49;
  
  if ((int)objects < (int)in_pad) {
    local_14c = (uint)((long)((ulong)(uint)((int)in_pad >> 0x1f) << 0x20 |
                             (ulong)in_pad & 0xffffffff) / (long)stride);
    uVar9 = cls_pred->h / (int)local_14c;
  }
  else {
    uVar9 = (uint)((long)((ulong)(uint)((int)objects >> 0x1f) << 0x20 | (ulong)objects & 0xffffffff)
                  / (long)stride);
    local_14c = cls_pred->h / (int)uVar9;
  }
  iVar1 = dis_pred->w;
  iVar3 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  if (0 < (int)uVar9) {
    uVar4 = iVar3 >> 2;
    uVar2 = cls_pred->w;
    fVar15 = (float)stride;
    local_a0 = (long)(int)uVar4 * 4;
    uVar10 = (ulong)local_14c;
    local_b8 = (ulong)uVar9;
    local_110 = 0;
    local_140 = 0;
    local_108 = dis_pred;
    local_b0 = uVar10;
    local_a8 = cls_pred;
    local_98 = in_R9;
    do {
      if (0 < (int)local_14c) {
        local_90 = local_140 * uVar10;
        local_88 = ZEXT416((uint)(((float)(int)local_140 + 0.5) * fVar15));
        uVar12 = 0;
        lVar11 = local_110;
        do {
          if (0 < (int)uVar2) {
            uVar13 = 0xffffffff;
            uVar7 = 0;
            fVar16 = -3.4028235e+38;
            do {
              fVar14 = *(float *)((long)cls_pred->data +
                                 uVar7 * 4 + cls_pred->elemsize * lVar11 * (long)cls_pred->w);
              if (fVar16 < fVar14) {
                uVar13 = uVar7 & 0xffffffff;
                fVar16 = fVar14;
              }
              uVar7 = uVar7 + 1;
            } while (uVar2 != uVar7);
            if (0.4 <= fVar16) {
              local_100 = (void *)((local_90 + uVar12) * (long)local_108->w * local_108->elemsize +
                                  (long)local_108->data);
              local_f8 = (int *)0x0;
              local_f0 = 4;
              local_e8 = 1;
              local_e0 = (long *)0x0;
              local_d8 = 2;
              local_d0 = 0x100000004;
              local_c8 = 1;
              local_c0 = local_a0;
              local_d4 = uVar4;
              pLVar5 = ncnn::create_layer("Softmax");
              ncnn::ParamDict::ParamDict(&local_128);
              ncnn::ParamDict::set(&local_128,0,1);
              ncnn::ParamDict::set(&local_128,1,1);
              (*pLVar5->_vptr_Layer[2])(pLVar5,&local_128);
              ncnn::Option::Option((Option *)local_70);
              local_70._4_4_ = 1.4013e-45;
              local_49 = false;
              (*pLVar5->_vptr_Layer[4])(pLVar5,(Option *)local_70);
              (*pLVar5->_vptr_Layer[9])(pLVar5,&local_100,(Option *)local_70);
              (*pLVar5->_vptr_Layer[5])(pLVar5);
              (*pLVar5->_vptr_Layer[1])(pLVar5);
              ncnn::ParamDict::~ParamDict(&local_128);
              cls_pred = local_a8;
              lVar8 = 0;
              pvVar6 = local_100;
              do {
                fVar14 = 0.0;
                if (3 < iVar1) {
                  uVar10 = 0;
                  do {
                    fVar14 = fVar14 + (float)(int)uVar10 * *(float *)((long)pvVar6 + uVar10 * 4);
                    uVar10 = uVar10 + 1;
                  } while (uVar4 != uVar10);
                }
                *(float *)((long)&local_128._vptr_ParamDict + lVar8 * 4) = fVar14 * fVar15;
                lVar8 = lVar8 + 1;
                pvVar6 = (void *)((long)pvVar6 + (int)local_d4 * local_f0);
              } while (lVar8 != 4);
              fVar14 = ((float)(int)uVar12 + 0.5) * fVar15;
              local_70._0_4_ = fVar14 - SUB84(local_128._vptr_ParamDict,0);
              local_70._4_4_ =
                   (float)local_88._0_4_ - (float)((ulong)local_128._vptr_ParamDict >> 0x20);
              local_70._8_4_ = (SUB84(local_128.d,0) + fVar14) - (float)local_70._0_4_;
              fStack_64 = ((float)((ulong)local_128.d >> 0x20) + (float)local_88._0_4_) -
                          (float)local_70._4_4_;
              local_60 = (int)uVar13;
              local_5c = fVar16;
              std::vector<Object,_std::allocator<Object>_>::push_back
                        (local_98,(value_type *)local_70);
              uVar10 = local_b0;
              if (local_f8 != (int *)0x0) {
                LOCK();
                *local_f8 = *local_f8 + -1;
                UNLOCK();
                if (*local_f8 == 0) {
                  if (local_e0 == (long *)0x0) {
                    if (local_100 != (void *)0x0) {
                      free(local_100);
                      uVar10 = local_b0;
                    }
                  }
                  else {
                    (**(code **)(*local_e0 + 0x18))();
                    uVar10 = local_b0;
                  }
                }
              }
            }
          }
          uVar12 = uVar12 + 1;
          lVar11 = lVar11 + 1;
        } while (uVar12 != uVar10);
      }
      local_140 = local_140 + 1;
      local_110 = local_110 + uVar10;
    } while (local_140 != local_b8);
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& cls_pred, const ncnn::Mat& dis_pred, int stride, const ncnn::Mat& in_pad, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = cls_pred.h;

    int num_grid_x;
    int num_grid_y;
    if (in_pad.w > in_pad.h)
    {
        num_grid_x = in_pad.w / stride;
        num_grid_y = num_grid / num_grid_x;
    }
    else
    {
        num_grid_y = in_pad.h / stride;
        num_grid_x = num_grid / num_grid_y;
    }

    const int num_class = cls_pred.w;
    const int reg_max_1 = dis_pred.w / 4;

    for (int i = 0; i < num_grid_y; i++)
    {
        for (int j = 0; j < num_grid_x; j++)
        {
            const int idx = i * num_grid_x + j;

            const float* scores = cls_pred.row(idx);

            // find label with max score
            int label = -1;
            float score = -FLT_MAX;
            for (int k = 0; k < num_class; k++)
            {
                if (scores[k] > score)
                {
                    label = k;
                    score = scores[k];
                }
            }

            if (score >= prob_threshold)
            {
                ncnn::Mat bbox_pred(reg_max_1, 4, (void*)dis_pred.row(idx));
                {
                    ncnn::Layer* softmax = ncnn::create_layer("Softmax");

                    ncnn::ParamDict pd;
                    pd.set(0, 1); // axis
                    pd.set(1, 1);
                    softmax->load_param(pd);

                    ncnn::Option opt;
                    opt.num_threads = 1;
                    opt.use_packing_layout = false;

                    softmax->create_pipeline(opt);

                    softmax->forward_inplace(bbox_pred, opt);

                    softmax->destroy_pipeline(opt);

                    delete softmax;
                }

                float pred_ltrb[4];
                for (int k = 0; k < 4; k++)
                {
                    float dis = 0.f;
                    const float* dis_after_sm = bbox_pred.row(k);
                    for (int l = 0; l < reg_max_1; l++)
                    {
                        dis += l * dis_after_sm[l];
                    }

                    pred_ltrb[k] = dis * stride;
                }

                float pb_cx = (j + 0.5f) * stride;
                float pb_cy = (i + 0.5f) * stride;

                float x0 = pb_cx - pred_ltrb[0];
                float y0 = pb_cy - pred_ltrb[1];
                float x1 = pb_cx + pred_ltrb[2];
                float y1 = pb_cy + pred_ltrb[3];

                Object obj;
                obj.rect.x = x0;
                obj.rect.y = y0;
                obj.rect.width = x1 - x0;
                obj.rect.height = y1 - y0;
                obj.label = label;
                obj.prob = score;

                objects.push_back(obj);
            }
        }
    }
}